

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O0

void __thiscall
Js::SourceDynamicProfileManager::SaveToDynamicProfileStorage
          (SourceDynamicProfileManager *this,char16 *url)

{
  code *pcVar1;
  BufferSizeCounter BVar2;
  bool bVar3;
  undefined4 *puVar4;
  size_t sVar5;
  char *buffer;
  undefined1 local_38 [8];
  BufferWriter writer;
  char *record;
  BufferSizeCounter counter;
  char16 *url_local;
  SourceDynamicProfileManager *this_local;
  
  counter.count = (size_t)url;
  bVar3 = DynamicProfileStorage::IsEnabled();
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                ,0x1aa,"(DynamicProfileStorage::IsEnabled())",
                                "DynamicProfileStorage::IsEnabled()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BufferSizeCounter::BufferSizeCounter((BufferSizeCounter *)&record);
  bVar3 = Serialize<Js::BufferSizeCounter>(this,(BufferSizeCounter *)&record);
  if ((bVar3) &&
     (sVar5 = BufferSizeCounter::GetByteCount((BufferSizeCounter *)&record), sVar5 < 0x100000000)) {
    sVar5 = BufferSizeCounter::GetByteCount((BufferSizeCounter *)&record);
    writer.lengthLeft = (size_t)DynamicProfileStorage::AllocRecord((DWORD)sVar5);
    bVar3 = Phases::IsEnabled((Phases *)&DAT_01ebe7c8,DynamicProfilePhase);
    BVar2 = counter;
    if (bVar3) {
      sVar5 = BufferSizeCounter::GetByteCount((BufferSizeCounter *)&record);
      Output::Print(L"%-180s : %d bytes\n",BVar2.count,sVar5);
    }
    buffer = DynamicProfileStorage::GetRecordBuffer((char *)writer.lengthLeft);
    sVar5 = BufferSizeCounter::GetByteCount((BufferSizeCounter *)&record);
    BufferWriter::BufferWriter((BufferWriter *)local_38,buffer,sVar5);
    bVar3 = Serialize<Js::BufferWriter>(this,(BufferWriter *)local_38);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                  ,0x1c2,"(false)","false");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
      DynamicProfileStorage::DeleteRecord((char *)writer.lengthLeft);
    }
    DynamicProfileStorage::SaveRecord((char16 *)counter.count,(char *)writer.lengthLeft);
  }
  return;
}

Assistant:

void
    SourceDynamicProfileManager::SaveToDynamicProfileStorage(char16 const * url)
    {
        Assert(DynamicProfileStorage::IsEnabled());
        BufferSizeCounter counter;
        if (!this->Serialize(&counter))
        {
            return;
        }

        if (counter.GetByteCount() > UINT_MAX)
        {
            // too big
            return;
        }

        char * record = DynamicProfileStorage::AllocRecord(static_cast<DWORD>(counter.GetByteCount()));
#if DBG_DUMP
        if (PHASE_STATS1(DynamicProfilePhase))
        {
            Output::Print(_u("%-180s : %d bytes\n"), url, counter.GetByteCount());
        }
#endif

        BufferWriter writer(DynamicProfileStorage::GetRecordBuffer(record), counter.GetByteCount());
        if (!this->Serialize(&writer))
        {
            Assert(false);
            DynamicProfileStorage::DeleteRecord(record);
        }

        DynamicProfileStorage::SaveRecord(url, record);
    }